

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void nn_append_string(nn_parse_context *ctx,nn_option *opt,char *str)

{
  long *plVar1;
  void *pvVar2;
  nn_string_list *lst;
  char *str_local;
  nn_option *opt_local;
  nn_parse_context *ctx_local;
  
  plVar1 = (long *)((long)ctx->target + (long)opt->offset);
  if (*plVar1 == 0) {
    pvVar2 = malloc(8);
    *plVar1 = (long)pvVar2;
    *(undefined4 *)(plVar1 + 2) = 1;
  }
  else {
    *(int *)(plVar1 + 2) = (int)plVar1[2] + 1;
    pvVar2 = realloc((void *)*plVar1,(long)(int)plVar1[2] << 3);
    *plVar1 = (long)pvVar2;
  }
  if (*plVar1 == 0) {
    nn_memory_error(ctx);
  }
  *(char **)(*plVar1 + (long)((int)plVar1[2] + -1) * 8) = str;
  return;
}

Assistant:

static void nn_append_string (struct nn_parse_context *ctx,
                             struct nn_option *opt, char *str)
{
    struct nn_string_list *lst;

    lst = (struct nn_string_list *)(
        ((char *)ctx->target) + opt->offset);
    if (lst->items) {
        lst->num += 1;
        lst->items = realloc (lst->items, sizeof (char *) * lst->num);
    } else {
        lst->items = malloc (sizeof (char *));
        lst->num = 1;
    }
    if (!lst->items) {
        nn_memory_error (ctx);
    }
    lst->items[lst->num-1] = str;
}